

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

void QtPrivate::QDebugStreamOperatorForType<QSharedMemory::AccessMode,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long in_FS_OFFSET;
  QDebug local_20;
  QDebug local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (QDebug)dbg->stream;
  (local_20.stream)->ref = (local_20.stream)->ref + 1;
  ::operator<<((Stream *)&local_18,(AccessMode)&local_20);
  QDebug::~QDebug(&local_18);
  QDebug::~QDebug(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }